

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HebrewCalendar.cpp
# Opt level: O3

int __thiscall HebrewCalendar::operator_cast_to_int(HebrewCalendar *this)

{
  int iVar1;
  int iVar2;
  int year;
  int iVar3;
  HebrewCalendar *this_00;
  int iVar4;
  
  iVar2 = (this->super_Calendar).month;
  iVar4 = (this->super_Calendar).day;
  if (iVar2 < 7) {
    year = (this->super_Calendar).year;
    iVar3 = 7;
    do {
      this_00 = this;
      iVar1 = LastMonthDay(this,iVar3,year);
      iVar4 = iVar4 + iVar1;
      iVar3 = iVar3 + 1;
    } while (((year * 7 + 1) % 0x13 < 7) + 0xd != iVar3);
    if (1 < iVar2) {
      iVar3 = 1;
      do {
        this_00 = this;
        iVar1 = LastMonthDay(this,iVar3,year);
        iVar4 = iVar4 + iVar1;
        iVar3 = iVar3 + 1;
      } while (iVar2 != iVar3);
    }
  }
  else {
    year = (this->super_Calendar).year;
    this_00 = this;
    if (iVar2 != 7) {
      iVar3 = 7;
      do {
        this_00 = this;
        iVar1 = LastMonthDay(this,iVar3,year);
        iVar4 = iVar4 + iVar1;
        iVar3 = iVar3 + 1;
      } while (iVar2 != iVar3);
    }
  }
  iVar2 = HebrewCalendarElapsedDays(this_00,year);
  return iVar2 + iVar4 + -0x14f4f5;
}

Assistant:

HebrewCalendar::operator int() { // Computes the absolute date of HebrewCalendar date.
    int DayInYear = day; // Days so far this month.
    if (month < 7) { // Before Tishri, so add days in prior months
        // this year before and after Nisan.
        int m = 7;
        while (m <= (LastMonthOfHebrewYear(year))) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        };
        m = 1;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    else { // Add days in prior months this year
        int m = 7;
        while (m < month) {
            DayInYear = DayInYear + LastMonthDay(m, year);
            m++;
        }
    }
    int d = DayInYear +
            (HebrewCalendarElapsedDays(year)// Days in prior years.
                    + HebrewEpoch);
    return d;         // Days elapsed before absolute date 1.
}